

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O2

void sigmund_tweak(int npts,t_float *ftreal,t_float *ftimag,int npeak,t_peak_conflict *peaks,
                  t_float fperbin,int loud)

{
  uint *puVar1;
  float *pfVar2;
  size_t __size;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  ulong __nmemb;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long *plVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  size_t sStack_170;
  uint local_168 [2];
  t_peak_conflict negpeak;
  float local_70 [2];
  t_float ampreal [3];
  t_float ampimag [3];
  
  lVar6 = -((long)(int)(npeak + 1U) * 8 + 0xfU & 0xfffffffffffffff0);
  plVar14 = (long *)((long)local_168 + lVar6);
  if (0 < npeak) {
    fVar7 = (float)npts;
    __nmemb = (ulong)(uint)npeak;
    for (uVar10 = 0; __nmemb != uVar10; uVar10 = uVar10 + 1) {
      *(t_peak_conflict **)((long)&negpeak + uVar10 * 8 + lVar6) = peaks;
      peaks = peaks + 1;
    }
    *(undefined8 *)((long)&sStack_170 + lVar6) = 8;
    __size = *(size_t *)((long)&sStack_170 + lVar6);
    *(undefined8 *)((long)&sStack_170 + lVar6) = 0x1a35ee;
    qsort((void *)((long)&negpeak + lVar6),__nmemb,__size,sigmund_cmp_freq);
    *plVar14 = (long)local_168;
    puVar1 = *(uint **)((long)&negpeak + lVar6);
    negpeak.p_freq = (t_float)puVar1[2];
    uVar15 = (uint)DAT_001a5450;
    negpeak.p_amp = (t_float)(puVar1[3] ^ uVar15);
    local_168[0] = *puVar1 ^ uVar15;
    *(undefined8 *)((long)&sStack_170 + lVar6) = 1;
    for (uVar10 = *(ulong *)((long)&sStack_170 + lVar6); uVar10 != npeak + 1U; uVar10 = uVar10 + 1)
    {
      iVar9 = (int)(*(float *)plVar14[uVar10] * (1.0 / fperbin) + 0.5);
      if ((-1 < iVar9) && (iVar9 <= npts * 2 + -3)) {
        lVar11 = 0;
        while( true ) {
          if (lVar11 == 6) break;
          iVar12 = (int)lVar11 + iVar9 + -2;
          *(t_float *)((long)local_70 + lVar11 * 2) = ftreal[iVar12];
          *(t_float *)((long)ampreal + lVar11 * 2 + 4) = ftimag[iVar12];
          lVar11 = lVar11 + 2;
        }
        for (lVar11 = 0; lVar11 != (ulong)(uVar10 != __nmemb) + 1; lVar11 = lVar11 + 1) {
          pfVar2 = *(float **)((long)&sStack_170 + lVar11 * 0x10 + uVar10 * 8 + lVar6);
          fVar16 = pfVar2[2] * (float)npts;
          fVar17 = pfVar2[3] * (float)npts;
          negpeak.p_salience = -fVar17;
          negpeak.p_tmp = -0.0;
          for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 2) {
            fVar8 = (*pfVar2 * (float)((uint)(1.0 / fperbin) ^ uVar15) +
                    (float)((int)lVar13 + iVar9 + -2)) * 1.5707964;
            *(undefined8 *)((long)&sStack_170 + lVar6) = 0x1a37a5;
            dVar3 = sin((double)fVar8);
            dVar4 = (double)(((fVar7 + -0.5) / fVar7) * fVar8);
            *(undefined8 *)((long)&sStack_170 + lVar6) = 0x1a37de;
            dVar5 = cos(dVar4);
            *(undefined8 *)((long)&sStack_170 + lVar6) = 0x1a37f0;
            dVar4 = sin(dVar4);
            fVar18 = -1.0;
            if (0.003 <= ABS(fVar8)) {
              fVar18 = -(float)dVar3 / fVar8;
            }
            *(float *)((long)local_70 + lVar13 * 2) =
                 ((float)dVar5 * fVar16 + negpeak.p_salience * (float)dVar4) * fVar18 +
                 *(float *)((long)local_70 + lVar13 * 2);
            *(float *)((long)ampreal + lVar13 * 2 + 4) =
                 ((float)dVar4 * fVar16 + fVar17 * (float)dVar5) * fVar18 +
                 *(float *)((long)ampreal + lVar13 * 2 + 4);
          }
        }
        fVar16 = local_70[1] * 0.5 + (local_70[0] + ampreal[0]) * -0.25;
        fVar8 = ampreal[2] * 0.5 + (ampreal[1] + ampimag[0]) * -0.25;
        fVar21 = fVar16 * fVar16 + fVar8 * fVar8;
        fVar17 = ((ampreal[2] - (ampreal[1] + ampimag[0]) * 0.5) * (ampreal[1] - ampimag[0]) * 0.5 +
                 (local_70[1] - (local_70[0] + ampreal[0]) * 0.5) * (local_70[0] - ampreal[0]) * 0.5
                 ) / (fVar21 * 4.0);
        fVar18 = 0.5;
        if ((fVar17 <= 0.5) && (fVar18 = fVar17, fVar17 < -0.5)) {
          fVar18 = -0.5;
        }
        fVar17 = fVar18 * 3.1415927;
        dVar3 = (double)fVar17;
        *(undefined8 *)((long)&sStack_170 + lVar6) = 0x1a39ce;
        dVar4 = sin(dVar3);
        *(undefined8 *)((long)&sStack_170 + lVar6) = 0x1a39df;
        dVar5 = cos(dVar3);
        pfVar2 = (float *)plVar14[uVar10];
        *pfVar2 = (fVar18 + fVar18 + (float)iVar9) * fperbin;
        fVar18 = (float)dVar4;
        auVar19._4_4_ = fVar18;
        auVar19._0_4_ = fVar18;
        auVar19._8_4_ = fVar18;
        auVar19._12_4_ = fVar18;
        auVar20._0_4_ = (float)(dVar3 + 3.141592653589793);
        auVar20._4_4_ = (float)(dVar3 + -3.141592653589793);
        auVar20._8_8_ = 0;
        auVar19 = divps(auVar19,auVar20);
        fVar17 = (1.0 / (float)((double)(-(ulong)(ABS(fVar17) < 0.003) & 0x3ff0000000000000 |
                                        ~-(ulong)(ABS(fVar17) < 0.003) &
                                        (ulong)(double)(fVar18 / fVar17)) * 0.5 +
                               (double)((float)(-(uint)(ABS(auVar20._4_4_) < 0.003) & 0x3f800000 |
                                               ~-(uint)(ABS(auVar20._4_4_) < 0.003) & auVar19._4_4_)
                                       + (float)(-(uint)(ABS(auVar20._0_4_) < 0.003) & 0x3f800000 |
                                                ~-(uint)(ABS(auVar20._0_4_) < 0.003) & auVar19._0_4_
                                                )) * -0.25)) * (1.0 / fVar7);
        pfVar2[1] = fVar17 * SQRT(fVar21);
        pfVar2[2] = fVar17 * (fVar16 * (float)dVar5 + fVar18 * -fVar8);
        pfVar2[3] = fVar17 * (fVar16 * fVar18 + (float)dVar5 * fVar8);
      }
    }
  }
  return;
}

Assistant:

static void sigmund_tweak(int npts, t_float *ftreal, t_float *ftimag,
    int npeak, t_peak *peaks, t_float fperbin, int loud)
{
    t_peak **peakptrs = (t_peak **)alloca(sizeof (*peakptrs) * (npeak+1));
    t_peak negpeak;
    int peaki, j, k;
    t_float ampreal[3], ampimag[3];
    t_float binperf = 1./fperbin;
    t_float phaseperbin = (npts-0.5)/npts, oneovern = 1./npts;
    if (npeak < 1)
        return;
    for (peaki = 0; peaki < npeak; peaki++)
        peakptrs[peaki+1] = &peaks[peaki];
    qsort(peakptrs+1, npeak, sizeof (*peakptrs), sigmund_cmp_freq);
    peakptrs[0] = &negpeak;
    negpeak.p_ampreal = peakptrs[1]->p_ampreal;
    negpeak.p_ampimag = -peakptrs[1]->p_ampimag;
    negpeak.p_freq = -peakptrs[1]->p_freq;
    for (peaki = 1; peaki <= npeak; peaki++)
    {
        int cbin = peakptrs[peaki]->p_freq*binperf + 0.5;
        int nsub = (peaki == npeak ? 1:2);
        t_float windreal, windimag, windpower, detune, pidetune, sinpidetune,
            cospidetune, ampcorrect, ampout, ampoutreal, ampoutimag, freqout;
        /* post("3 nsub %d amp %f freq %f", nsub,
            peakptrs[peaki]->p_amp, peakptrs[peaki]->p_freq); */
        if (cbin < 0 || cbin > 2*npts - 3)
            continue;
        for (j = 0; j < 3; j++)
            ampreal[j] = ftreal[cbin+2*j-2], ampimag[j] = ftimag[cbin+2*j-2];
        /* post("a %f %f", ampreal[1], ampimag[1]); */
        for (j = 0; j < nsub; j++)
        {
            t_peak *neighbor = peakptrs[(peaki-1) + 2*j];
            t_float neighborreal = npts * neighbor->p_ampreal;
            t_float neighborimag = npts * neighbor->p_ampimag;
            for (k = 0; k < 3; k++)
            {
                t_float freqdiff = (0.5*PI) * ((cbin + 2*k-2)
                    -binperf * neighbor->p_freq);
                t_float sx = sinx(freqdiff, sin(freqdiff));
                t_float phasere = cos(freqdiff * phaseperbin);
                t_float phaseim = sin(freqdiff * phaseperbin);
                ampreal[k] -=
                    sx * (phasere * neighborreal - phaseim * neighborimag);
                ampimag[k] -=
                    sx * (phaseim * neighborreal + phasere * neighborimag);
            }       
            /* post("b %f %f", ampreal[1], ampimag[1]); */
        }

        windreal = W_ALPHA * ampreal[1] -
            (0.5 * W_BETA) * (ampreal[0] + ampreal[2]);
        windimag = W_ALPHA * ampimag[1] -
            (0.5 * W_BETA) * (ampimag[0] + ampimag[2]);
        windpower = windreal * windreal + windimag * windimag;
        detune = (
            W_BETA*(ampreal[0] - ampreal[2]) * 
                (2.0*W_ALPHA * ampreal[1] - W_BETA * (ampreal[0] + ampreal[2]))
                    +
            W_BETA*(ampimag[0] - ampimag[2]) *
                (2.0*W_ALPHA * ampimag[1] - W_BETA * (ampimag[0] + ampimag[2]))
                        ) / (4.0 * windpower);
        if (detune > 0.5)
            detune = 0.5;
        else if (detune < -0.5)
            detune = -0.5;
        /* if (loud > 0)
            post("tweak: windpower %f, bin %d, detune %f",
                windpower, cbin, detune); */
        pidetune = PI * detune;
        sinpidetune = sin(pidetune);
        cospidetune = cos(pidetune);

        ampcorrect = 1.0 / window_hann_mag(pidetune, sinpidetune);

        ampout = oneovern * ampcorrect *sqrt(windpower);
        ampoutreal = oneovern * ampcorrect *
            (windreal * cospidetune - windimag * sinpidetune);
        ampoutimag = oneovern * ampcorrect *
            (windreal * sinpidetune + windimag * cospidetune);
        freqout = (cbin + 2*detune) * fperbin;
        /* if (loud > 1)
            post("amp %f, freq %f", ampout, freqout); */
        
        peakptrs[peaki]->p_freq = freqout;
        peakptrs[peaki]->p_amp = ampout;
        peakptrs[peaki]->p_ampreal = ampoutreal;
        peakptrs[peaki]->p_ampimag = ampoutimag;
    }
}